

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextInput::matchAgg(AspifTextInput *this)

{
  bool bVar1;
  Lit_t LVar2;
  WeightLit_t in_RDI;
  WeightLit_t wl;
  bool in_stack_0000004f;
  char *in_stack_00000050;
  AspifTextInput *in_stack_00000058;
  int iVar3;
  WeightLit_t lit;
  
  lit = in_RDI;
  bVar1 = match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  if ((bVar1) && (bVar1 = match(in_stack_00000058,in_stack_00000050,in_stack_0000004f), !bVar1)) {
    do {
      LVar2 = matchLit((AspifTextInput *)in_RDI);
      iVar3 = 1;
      bVar1 = match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
      if (bVar1) {
        iVar3 = matchInt((AspifTextInput *)in_RDI);
      }
      RuleBuilder::addGoal((RuleBuilder *)CONCAT44(iVar3,LVar2),lit);
      bVar1 = match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
    } while (bVar1);
    match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  }
  return;
}

Assistant:

void AspifTextInput::matchAgg() {
	if (match("{") && !match("}", false)) {
		do {
			WeightLit_t wl = {matchLit(), 1};
			if (match("=", false)) { wl.weight = matchInt(); }
			data_->rule.addGoal(wl);
		}
		while (match(",", false));
		match("}");
	}
}